

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O2

void polyscope::view::setNavigateStyle(NavigateStyle newStyle,bool animateFlight)

{
  int iVar1;
  mat4 mStack_48;
  
  iVar1 = style;
  style = newStyle;
  if ((newStyle != Free) && ((newStyle != FirstPerson || (iVar1 != 0)))) {
    if (!animateFlight) {
      resetCameraToHomeView();
      return;
    }
    computeHomeView();
    nearClipRatio = 0x3f747ae147ae147b;
    farClipRatio = 0x4034000000000000;
    startFlightTo(&mStack_48,45.0,0.4);
    return;
  }
  return;
}

Assistant:

void setNavigateStyle(NavigateStyle newStyle, bool animateFlight) {
  NavigateStyle oldStyle = style;
  style = newStyle;

  // for a few combinations of views, we can leave the camera where it is rather than resetting to the home view
  if (newStyle == NavigateStyle::Free ||
      (newStyle == NavigateStyle::FirstPerson && oldStyle == NavigateStyle::Turntable)) {
    return;
  }

  // reset to the home view
  if (animateFlight) {
    flyToHomeView();
  } else {
    resetCameraToHomeView();
  }
}